

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialog::~QFileDialog(QFileDialog *this)

{
  QFileDialogPrivate *this_00;
  QPlatformDialogHelper *pQVar1;
  long in_FS_OFFSET;
  code *local_38;
  undefined8 local_30;
  code *local_28;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)&(this->super_QDialog).super_QWidget = &PTR_metaObject_0080f8d0;
  *(undefined ***)&(this->super_QDialog).super_QWidget.super_QPaintDevice =
       &PTR__QFileDialog_0080faa8;
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QFileDialogPrivate::saveSettings(this_00);
  pQVar1 = QDialogPrivate::platformHelper(&this_00->super_QDialogPrivate);
  if (pQVar1 != (QPlatformDialogHelper *)0x0) {
    local_28 = QPlatformFileDialogHelper::directoryEntered;
    local_20 = 0;
    local_38 = QFileDialogPrivate::nativeEnterDirectory;
    local_30 = 0;
    QObject::disconnectImpl
              ((QObject *)pQVar1,&local_28,
               *(QObject **)&(this_00->super_QDialogPrivate).super_QWidgetPrivate.field_0x8,
               &local_38,(QMetaObject *)&QPlatformFileDialogHelper::staticMetaObject);
  }
  QDialog::~QDialog(&this->super_QDialog);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFileDialog::~QFileDialog()
{
    Q_D(QFileDialog);
#if QT_CONFIG(settings)
    d->saveSettings();
#endif
    if (QPlatformFileDialogHelper *platformHelper = d->platformFileDialogHelper()) {
        // QIOSFileDialog emits directoryChanged while hiding, causing an assert
        // because of a partially destroyed QFileDialog.
        QObjectPrivate::disconnect(platformHelper, &QPlatformFileDialogHelper::directoryEntered,
                                   d, &QFileDialogPrivate::nativeEnterDirectory);
    }
}